

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuCreate.c
# Opt level: O2

void Fxu_CreateCoversNode
               (Fxu_Matrix *p,Fxu_Data_t *pData,int iNode,Fxu_Cube *pCubeFirst,Fxu_Cube *pCubeNext)

{
  Fxu_Var **ppFVar1;
  uint nVars;
  Fxu_Lit *pFVar2;
  long lVar3;
  int iVar4;
  int *piVar5;
  void *__base;
  ulong uVar6;
  Fxu_Cube *pFVar7;
  char *pSop;
  byte bVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  Fxu_Var *pFVar13;
  int iVar14;
  Fxu_Var **ppFVar15;
  Fxu_ListLit *pFVar16;
  
  ppFVar1 = &p->pOrderVars;
  p->ppTailVars = ppFVar1;
  p->pOrderVars = (Fxu_Var *)0x0;
  ppFVar15 = ppFVar1;
  for (pFVar7 = pCubeFirst; pFVar7 != pCubeNext; pFVar7 = pFVar7->pNext) {
    pFVar16 = &pFVar7->lLits;
    while (pFVar2 = pFVar16->pHead, pFVar2 != (Fxu_Lit *)0x0) {
      pFVar13 = p->ppVars[(pFVar2->pVar->iVar / 2) * 2 + 1];
      if (pFVar13->pOrder == (Fxu_Var *)0x0) {
        *ppFVar15 = pFVar13;
        ppFVar15 = &pFVar13->pOrder;
        p->ppTailVars = ppFVar15;
        pFVar13->pOrder = (Fxu_Var *)0x1;
      }
      pFVar16 = (Fxu_ListLit *)&pFVar2->pHNext;
    }
  }
  piVar5 = (int *)malloc(0x10);
  piVar5[0] = 0x10;
  piVar5[1] = 0;
  __base = malloc(0x40);
  *(void **)(piVar5 + 2) = __base;
  pFVar13 = *ppFVar1;
  if (pFVar13 != (Fxu_Var *)0x0) {
    iVar11 = 0;
    uVar6 = 0x10;
    for (; pFVar13 != (Fxu_Var *)0x1; pFVar13 = pFVar13->pOrder) {
      iVar4 = pFVar13->iVar;
      iVar14 = (int)uVar6;
      iVar10 = iVar11;
      if (iVar11 == iVar14) {
        uVar12 = (ulong)(uint)(iVar14 * 2);
        if (iVar14 < 0x10) {
          uVar12 = 0x10;
        }
        iVar10 = iVar14;
        if (iVar14 < (int)uVar12) {
          if (__base == (void *)0x0) {
            __base = malloc(uVar12 << 2);
          }
          else {
            __base = realloc(__base,uVar12 << 2);
          }
          *(void **)(piVar5 + 2) = __base;
          if (__base == (void *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          *piVar5 = (int)uVar12;
          uVar6 = uVar12;
          iVar10 = piVar5[1];
        }
      }
      iVar11 = iVar10 + 1;
      piVar5[1] = iVar11;
      *(int *)((long)__base + (long)iVar10 * 4) = iVar4 / 2;
    }
  }
  Fxu_MatrixRingVarsUnmark(p);
  qsort(__base,(long)piVar5[1],4,Vec_IntSortCompare1);
  nVars = piVar5[1];
  uVar6 = 0;
  uVar12 = 0;
  if (0 < (int)nVars) {
    uVar12 = (ulong)nVars;
  }
  for (; uVar12 != uVar6; uVar6 = uVar6 + 1) {
    ppFVar15 = p->ppVars;
    lVar3 = *(long *)(piVar5 + 2);
    (ppFVar15[(long)*(int *)(lVar3 + uVar6 * 4) * 2]->lLits).nItems = (int)uVar6;
    (ppFVar15[(long)*(int *)(lVar3 + uVar6 * 4) * 2 + 1]->lLits).nItems = (int)uVar6;
  }
  iVar11 = 0;
  for (pFVar7 = pCubeFirst; pFVar7 != pCubeNext; pFVar7 = pFVar7->pNext) {
    iVar11 = (iVar11 + 1) - (uint)((pFVar7->lLits).nItems == 0);
  }
  pSop = Abc_SopStart(pData->pManSop,iVar11,nVars);
  if ((iNode < pData->nNodesOld) &&
     (iVar11 = Abc_SopGetPhase((char *)pData->vSops->pArray[iNode]), iVar11 == 0)) {
    Abc_SopComplement(pSop);
  }
  iVar11 = 0;
  do {
    if (pCubeFirst == pCubeNext) {
      iVar4 = Abc_SopGetCubeNum(pSop);
      if (iVar11 != iVar4) {
        __assert_fail("nCubes == Abc_SopGetCubeNum(pSopCover)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuCreate.c"
                      ,399,
                      "void Fxu_CreateCoversNode(Fxu_Matrix *, Fxu_Data_t *, int, Fxu_Cube *, Fxu_Cube *)"
                     );
      }
      pData->vSopsNew->pArray[iNode] = pSop;
      pData->vFaninsNew->pArray[iNode] = piVar5;
      return;
    }
    if ((pCubeFirst->lLits).nItems != 0) {
      pFVar16 = &pCubeFirst->lLits;
      while (pFVar2 = pFVar16->pHead, pFVar2 != (Fxu_Lit *)0x0) {
        iVar4 = (pFVar2->pVar->lLits).nItems;
        if ((int)nVars <= iVar4) {
          __assert_fail("iNum < vInputsNew->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuCreate.c"
                        ,0x186,
                        "void Fxu_CreateCoversNode(Fxu_Matrix *, Fxu_Data_t *, int, Fxu_Cube *, Fxu_Cube *)"
                       );
        }
        iVar10 = pFVar2->pVar->iVar;
        bVar8 = (byte)iVar10 & 1;
        bVar9 = bVar8 | 0x30;
        if (iVar10 / 2 < pData->nNodesOld) {
          bVar9 = bVar8 ^ 0x31;
        }
        pSop[(long)iVar4 + (long)(int)((nVars + 3) * iVar11)] = bVar9;
        pFVar16 = (Fxu_ListLit *)&pFVar2->pHNext;
      }
      iVar11 = iVar11 + 1;
    }
    pCubeFirst = pCubeFirst->pNext;
  } while( true );
}

Assistant:

void Fxu_CreateCoversNode( Fxu_Matrix * p, Fxu_Data_t * pData, int iNode, Fxu_Cube * pCubeFirst, Fxu_Cube * pCubeNext )
{
    Vec_Int_t * vInputsNew;
    char * pSopCover, * pSopCube;
    Fxu_Var * pVar;
    Fxu_Cube * pCube;
    Fxu_Lit * pLit;
    int iNum, nCubes, v;

    // collect positive polarity variable in the cubes between pCubeFirst and pCubeNext
    Fxu_MatrixRingVarsStart( p );
    for ( pCube = pCubeFirst; pCube != pCubeNext; pCube = pCube->pNext )
        for ( pLit = pCube->lLits.pHead; pLit; pLit = pLit->pHNext )
        {
            pVar = p->ppVars[ 2 * (pLit->pVar->iVar/2) + 1 ];
            if ( pVar->pOrder == NULL )
                Fxu_MatrixRingVarsAdd( p, pVar );
        }
    Fxu_MatrixRingVarsStop( p );

    // collect the variable numbers
    vInputsNew = Vec_IntAlloc( 4 );
    Fxu_MatrixForEachVarInRing( p, pVar )
        Vec_IntPush( vInputsNew, pVar->iVar / 2 );
    Fxu_MatrixRingVarsUnmark( p );

    // sort the vars by their number
    Vec_IntSort( vInputsNew, 0 );

    // mark the vars with their numbers in the sorted array
    for ( v = 0; v < vInputsNew->nSize; v++ )
    {
        p->ppVars[ 2 * vInputsNew->pArray[v] + 0 ]->lLits.nItems = v; // hack - reuse lLits.nItems
        p->ppVars[ 2 * vInputsNew->pArray[v] + 1 ]->lLits.nItems = v; // hack - reuse lLits.nItems
    }

    // count the number of cubes
    nCubes = 0;
    for ( pCube = pCubeFirst; pCube != pCubeNext; pCube = pCube->pNext )
        if ( pCube->lLits.nItems )
            nCubes++;

    // allocate room for the new cover
    pSopCover = Abc_SopStart( pData->pManSop, nCubes, vInputsNew->nSize );
    // set the correct polarity of the cover
    if ( iNode < pData->nNodesOld && Abc_SopGetPhase( (char *)pData->vSops->pArray[iNode] ) == 0 )
        Abc_SopComplement( pSopCover );

    // add the cubes
    nCubes = 0;
    for ( pCube = pCubeFirst; pCube != pCubeNext; pCube = pCube->pNext )
    {
        if ( pCube->lLits.nItems == 0 )
            continue;
        // get hold of the SOP cube
        pSopCube = pSopCover + nCubes * (vInputsNew->nSize + 3);
        // insert literals
        for ( pLit = pCube->lLits.pHead; pLit; pLit = pLit->pHNext )
        {
            iNum = pLit->pVar->lLits.nItems; // hack - reuse lLits.nItems
            assert( iNum < vInputsNew->nSize );
            if ( pLit->pVar->iVar / 2 < pData->nNodesOld )
                pSopCube[iNum] = (pLit->pVar->iVar & 1)? '0' : '1';   // reverse CST
            else
                pSopCube[iNum] = (pLit->pVar->iVar & 1)? '1' : '0';   // no CST
        }
        // count the cube
        nCubes++;
    }
    assert( nCubes == Abc_SopGetCubeNum(pSopCover) );

    // set the new cover and the array of fanins
    pData->vSopsNew->pArray[iNode]   = pSopCover;
    pData->vFaninsNew->pArray[iNode] = vInputsNew;
}